

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O3

int __thiscall
QGIFFormat::decode(QGIFFormat *this,QImage *image,uchar *buffer,int length,int *nextFrameDelay,
                  int *loopCount)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  short *psVar6;
  short *psVar7;
  bool bVar8;
  Representation RVar9;
  QSize QVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  char cVar13;
  byte bVar14;
  uint uVar15;
  State SVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  Representation RVar20;
  short *psVar21;
  size_t sVar22;
  QRgb *pQVar23;
  void *pvVar24;
  uchar *puVar25;
  byte *pbVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  short *psVar32;
  uint uVar33;
  int iVar34;
  QSize QVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  undefined1 auVar44 [16];
  long lVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uchar *local_a0;
  long local_98;
  long lVar40;
  
  if (this->stack == (short *)0x0) {
    psVar21 = (short *)operator_new__(0x8000);
    this->stack = psVar21;
    this->table[0] = psVar21 + 0x2000;
    this->table[1] = psVar21 + 0x3000;
  }
  QImage::detach();
  local_98 = QImage::bytesPerLine();
  local_a0 = (uchar *)QImage::bits();
  this->digress = false;
  if (length == 0) {
    iVar36 = 0;
  }
  else {
    iVar36 = length;
    do {
      if (Error < this->state) goto LAB_00103e37;
      bVar14 = *buffer;
      uVar18 = (uint)bVar14;
      switch(this->state) {
      case Header:
        iVar17 = this->count;
        this->count = iVar17 + 1;
        this->hold[iVar17] = bVar14;
        if (this->count == 6) {
          this->gif89 = this->hold[4] != '7' || this->hold[3] != '8';
          this->state = LogicalScreenDescriptor;
          goto LAB_00103e2f;
        }
        break;
      case LogicalScreenDescriptor:
        iVar17 = this->count;
        this->count = iVar17 + 1;
        this->hold[iVar17] = bVar14;
        if (this->count == 7) {
          uVar31 = *(ulong *)this->hold;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar31;
          auVar11._12_2_ = (short)(uVar31 >> 0x30);
          auVar12._8_2_ = (short)(uVar31 >> 0x20);
          auVar12._0_8_ = uVar31;
          auVar12._10_4_ = auVar11._10_4_;
          auVar38._6_10_ = SUB1610(ZEXT616(auVar12._8_6_) << 0x40,6);
          auVar38._4_2_ = (short)(uVar31 >> 0x10);
          auVar38._0_2_ = (ushort)uVar31;
          auVar38._2_2_ = 0;
          this->swidth = (int)auVar38._0_8_;
          this->sheight = (int)((ulong)auVar38._0_8_ >> 0x20);
          bVar14 = this->hold[4];
          uVar15 = 2 << (bVar14 & 7);
          this->gcmap = (bool)-((char)bVar14 >> 7);
          this->gncols = uVar15;
          uVar18 = (uint)this->hold[5];
          if (-1 < (char)bVar14) {
            uVar18 = 0xffffffff;
          }
          this->bgcol = uVar18;
          this->trans_index = -1;
          this->count = 0;
          this->ncols = uVar15;
          if ((bool)-((char)bVar14 >> 7) != true) goto LAB_00103d10;
          this->ccount = 0;
          this->state = GlobalColorMap;
          pQVar23 = (QRgb *)operator_new__(8L << (bVar14 & 7) | 4);
          this->globalcmap = pQVar23;
          pQVar23[uVar15] = 0xffffff;
        }
        break;
      default:
        iVar17 = this->count;
        this->count = iVar17 + 1;
        this->hold[iVar17] = bVar14;
        if (this->count == 3) {
          uVar18 = (uint)this->hold[1] << 8 | *(int *)this->hold << 0x10 | (uint)this->hold[2] |
                   0xff000000;
          if (this->state == LocalColorMap) {
            iVar17 = this->ccount;
            if (iVar17 < this->lncols) {
              this->localcmap[iVar17] = uVar18;
              iVar17 = this->ccount;
            }
            iVar17 = iVar17 + 1;
            this->ccount = iVar17;
            SVar16 = TableImageLZWSize;
          }
          else {
            this->globalcmap[this->ccount] = uVar18;
            iVar17 = this->ccount + 1;
            this->ccount = iVar17;
            SVar16 = Introducer;
          }
          if (this->ncols <= iVar17) goto LAB_00103e2b;
          goto LAB_00103e2f;
        }
        break;
      case Introducer:
        iVar17 = this->count;
        this->count = iVar17 + 1;
        this->hold[iVar17] = bVar14;
        if (uVar18 == 0x21) {
          this->state = ExtensionLabel;
        }
        else if (uVar18 == 0x3b) {
          this->state = Done;
        }
        else if (uVar18 == 0x2c) {
          this->state = ImageDescriptor;
        }
        else {
          this->digress = true;
          this->state = Error;
        }
        break;
      case ImageDescriptor:
        iVar17 = this->count;
        this->count = iVar17 + 1;
        this->hold[iVar17] = bVar14;
        if (this->count == 10) {
          uVar15 = (uint)*(ushort *)(this->hold + 5);
          iVar17 = this->swidth;
          uVar18 = uVar15;
          if (this->hold[6] < 0x40) {
            uVar18 = 0x4000;
          }
          if ((int)uVar18 < iVar17 / 10) {
            this->swidth = -1;
            iVar17 = -1;
          }
          uVar33 = (uint)*(ushort *)(this->hold + 7);
          iVar27 = this->sheight;
          uVar18 = uVar33;
          if (this->hold[8] < 0x40) {
            uVar18 = 0x4000;
          }
          if ((int)uVar18 < iVar27 / 10) {
            this->sheight = -1;
            iVar27 = -1;
          }
          uVar3 = *(ushort *)(this->hold + 1);
          if (iVar17 < 1) {
            this->swidth = uVar15 + uVar3;
          }
          uVar4 = *(ushort *)(this->hold + 3);
          if (iVar27 < 1) {
            this->sheight = uVar33 + uVar4;
          }
          uVar18 = this->trans_index;
          cVar13 = QImage::isNull();
          if (cVar13 != '\0') {
            QVar10.wd.m_i = this->swidth;
            QVar10.ht.m_i = this->sheight;
            if ((0xfffffff < (ulong)((long)this->sheight * (long)this->swidth)) ||
               (cVar13 = QImageIOHandler::allocateImage(QVar10,~uVar18 >> 0x1f | Format_RGB32,image)
               , cVar13 == '\0')) goto LAB_001044b4;
            local_98 = QImage::bytesPerLine();
            local_a0 = (uchar *)QImage::bits();
            if (local_a0 == (uchar *)0x0) {
              local_a0 = (uchar *)0x0;
            }
            else {
              sVar22 = QImage::sizeInBytes();
              memset(local_a0,0,sVar22);
            }
          }
          cVar13 = QImage::isNull();
          if (cVar13 != '\0') goto LAB_001044b4;
          disposePrevious(this,image);
          this->disposed = false;
          this->left = (uint)uVar3;
          this->top = (uint)uVar4;
          this->width = uVar15;
          this->height = uVar33;
          iVar17 = uVar15 + uVar3;
          if (this->swidth <= iVar17) {
            iVar17 = this->swidth;
          }
          if (iVar17 < 2) {
            iVar17 = 1;
          }
          this->right = iVar17 + -1;
          iVar17 = uVar33 + uVar4;
          if (this->sheight <= iVar17) {
            iVar17 = this->sheight;
          }
          if (iVar17 < 2) {
            iVar17 = 1;
          }
          this->bottom = iVar17 + -1;
          bVar14 = this->hold[9];
          bVar8 = (bool)-((char)bVar14 >> 7);
          this->lcmap = bVar8;
          iVar17 = 2 << (bVar14 & 7);
          this->interlace = bVar14 >> 6 & 1;
          iVar27 = 0;
          if (bVar8 != false) {
            iVar27 = iVar17;
          }
          this->lncols = iVar27;
          if (bVar8 == true) {
            if (this->localcmap != (QRgb *)0x0) {
              operator_delete__(this->localcmap);
              iVar17 = this->lncols;
            }
            uVar31 = (long)iVar17 * 4 + 4;
            if (iVar17 < -1) {
              uVar31 = 0xffffffffffffffff;
            }
            pQVar23 = (QRgb *)operator_new__(uVar31);
            this->localcmap = pQVar23;
            pQVar23[iVar17] = 0xffffff;
          }
          else {
            iVar17 = this->gncols;
          }
          this->ncols = iVar17;
          piVar1 = &this->frame;
          *piVar1 = *piVar1 + 1;
          if ((*piVar1 == 0) &&
             (((this->top != 0 || this->left != 0 || (this->width < this->swidth)) ||
              (this->height < this->sheight)))) {
            uVar18 = this->trans_index;
            if ((int)uVar18 < 0) {
              if (-1 < this->bgcol) {
                uVar18 = this->bgcol & 0xff;
                uVar28 = 0xffffff;
                if ((int)uVar18 <= iVar17) {
                  if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                    uVar28 = 0;
                  }
                  else {
                    uVar28 = *(undefined4 *)
                              (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                              (ulong)uVar18 * 4);
                  }
                }
                uVar18 = this->swidth;
                iVar17 = this->sheight;
                if (0 < iVar17 && 0 < (int)uVar18) {
                  lVar30 = (ulong)uVar18 - 1;
                  auVar48._8_4_ = (int)lVar30;
                  auVar48._0_8_ = lVar30;
                  auVar48._12_4_ = (int)((ulong)lVar30 >> 0x20);
                  iVar27 = 0;
                  do {
                    lVar30 = QImage::scanLine((int)image);
                    auVar38 = _DAT_001060a0;
                    auVar47 = _DAT_00106090;
                    lVar29 = 0;
                    auVar44 = _DAT_00106080;
                    auVar42 = _DAT_00106070;
                    do {
                      iVar43 = SUB164(auVar48 ^ auVar47,0);
                      bVar8 = iVar43 < SUB164(auVar44 ^ auVar47,0);
                      iVar37 = SUB164(auVar48 ^ auVar47,4);
                      iVar19 = SUB164(auVar44 ^ auVar47,4);
                      if ((bool)(~(iVar37 < iVar19 || iVar19 == iVar37 && bVar8) & 1)) {
                        *(undefined4 *)(lVar30 + lVar29) = uVar28;
                      }
                      if (iVar37 >= iVar19 && (iVar19 != iVar37 || !bVar8)) {
                        *(undefined4 *)(lVar30 + 4 + lVar29) = uVar28;
                      }
                      iVar19 = SUB164(auVar42 ^ auVar47,4);
                      if (iVar19 <= iVar37 &&
                          (iVar19 != iVar37 || SUB164(auVar42 ^ auVar47,0) <= iVar43)) {
                        *(undefined4 *)(lVar30 + 8 + lVar29) = uVar28;
                        *(undefined4 *)(lVar30 + 0xc + lVar29) = uVar28;
                      }
                      lVar40 = auVar44._8_8_;
                      lVar45 = auVar38._0_8_;
                      auVar44._0_8_ = auVar44._0_8_ + lVar45;
                      lVar46 = auVar38._8_8_;
                      auVar44._8_8_ = lVar40 + lVar46;
                      lVar40 = auVar42._8_8_;
                      auVar42._0_8_ = auVar42._0_8_ + lVar45;
                      auVar42._8_8_ = lVar40 + lVar46;
                      lVar29 = lVar29 + 0x10;
                    } while ((ulong)(uVar18 + 3 >> 2) << 4 != lVar29);
                    iVar27 = iVar27 + 1;
                  } while (iVar27 != iVar17);
                }
              }
            }
            else {
              uVar15 = 0xffffff;
              if ((int)(uVar18 & 0xff) <= iVar17) {
                if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                  uVar33 = 0;
                }
                else {
                  uVar33 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                    (ulong)(uVar18 & 0xff) * 4);
                }
                uVar15 = uVar33 & 0xffffff;
                if (0xff < uVar18) {
                  uVar15 = uVar33;
                }
              }
              uVar18 = this->swidth;
              iVar17 = this->sheight;
              if (0 < iVar17 && 0 < (int)uVar18) {
                lVar30 = (ulong)uVar18 - 1;
                auVar47._8_4_ = (int)lVar30;
                auVar47._0_8_ = lVar30;
                auVar47._12_4_ = (int)((ulong)lVar30 >> 0x20);
                iVar27 = 0;
                auVar47 = auVar47 ^ _DAT_00106090;
                do {
                  lVar30 = QImage::scanLine((int)image);
                  auVar38 = _DAT_001060a0;
                  auVar48 = _DAT_00106090;
                  lVar29 = 0;
                  auVar39 = _DAT_00106080;
                  auVar41 = _DAT_00106070;
                  do {
                    auVar44 = auVar39 ^ auVar48;
                    iVar43 = auVar47._4_4_;
                    if ((bool)(~(auVar44._4_4_ == iVar43 && auVar47._0_4_ < auVar44._0_4_ ||
                                iVar43 < auVar44._4_4_) & 1)) {
                      *(uint *)(lVar30 + lVar29) = uVar15;
                    }
                    if ((auVar44._12_4_ != auVar47._12_4_ || auVar44._8_4_ <= auVar47._8_4_) &&
                        auVar44._12_4_ <= auVar47._12_4_) {
                      *(uint *)(lVar30 + 4 + lVar29) = uVar15;
                    }
                    auVar44 = auVar41 ^ auVar48;
                    iVar37 = auVar44._4_4_;
                    if (iVar37 <= iVar43 && (iVar37 != iVar43 || auVar44._0_4_ <= auVar47._0_4_)) {
                      *(uint *)(lVar30 + 8 + lVar29) = uVar15;
                      *(uint *)(lVar30 + 0xc + lVar29) = uVar15;
                    }
                    lVar40 = auVar39._8_8_;
                    lVar45 = auVar38._0_8_;
                    auVar39._0_8_ = auVar39._0_8_ + lVar45;
                    lVar46 = auVar38._8_8_;
                    auVar39._8_8_ = lVar40 + lVar46;
                    lVar40 = auVar41._8_8_;
                    auVar41._0_8_ = auVar41._0_8_ + lVar45;
                    auVar41._8_8_ = lVar40 + lVar46;
                    lVar29 = lVar29 + 0x10;
                  } while ((ulong)(uVar18 + 3 >> 2) << 4 != lVar29);
                  iVar27 = iVar27 + 1;
                } while (iVar27 != iVar17);
              }
            }
          }
          if (this->disposal == RestoreImage) {
            iVar27 = this->swidth + -1;
            iVar17 = this->left;
            if (iVar27 < this->left) {
              iVar17 = iVar27;
            }
            if (this->right <= iVar27) {
              iVar27 = this->right;
            }
            iVar37 = this->sheight + -1;
            iVar43 = this->top;
            if (iVar37 < this->top) {
              iVar43 = iVar37;
            }
            if (this->bottom <= iVar37) {
              iVar37 = this->bottom;
            }
            iVar34 = (iVar27 - iVar17) + 1;
            iVar37 = iVar37 - iVar43;
            uVar18 = iVar37 + 1;
            uVar31 = (ulong)uVar18;
            iVar19 = QImage::width();
            if ((iVar19 <= iVar27 - iVar17) || (iVar27 = QImage::height(), iVar27 <= iVar37)) {
              if ((ulong)((long)(int)uVar18 * (long)iVar34) < 0x10000000) {
                iVar27 = QImage::width();
                RVar9.m_i = iVar34;
                if (iVar34 < iVar27) {
                  RVar9.m_i = iVar27;
                }
                RVar20.m_i = QImage::height();
                if (RVar20.m_i <= (int)uVar18) {
                  RVar20.m_i = uVar18;
                }
                QVar35.ht.m_i = RVar20.m_i;
                QVar35.wd.m_i = RVar9.m_i;
                cVar13 = QImageIOHandler::allocateImage(QVar35,Format_RGB32,&this->backingstore);
                if (cVar13 != '\0') {
                  pvVar24 = (void *)QImage::bits();
                  sVar22 = QImage::sizeInBytes();
                  memset(pvVar24,0,sVar22);
                  goto LAB_001043ba;
                }
              }
LAB_001044b4:
              this->state = Error;
switchD_001033ba_caseD_11:
              return -1;
            }
LAB_001043ba:
            lVar30 = QImage::bytesPerLine();
            pvVar24 = (void *)QImage::bits();
            if (-1 < iVar37) {
              puVar25 = local_a0 + iVar43 * local_98 + (long)iVar17 * 4;
              do {
                memcpy(pvVar24,puVar25,(long)iVar34 << 2);
                puVar25 = puVar25 + local_98;
                pvVar24 = (void *)((long)pvVar24 + lVar30);
                uVar31 = uVar31 - 1;
              } while (uVar31 != 0);
            }
          }
          this->count = 0;
          SVar16 = TableImageLZWSize;
          if (this->lcmap == true) {
            this->ccount = 0;
            SVar16 = LocalColorMap;
          }
          this->state = SVar16;
          this->x = this->left;
          this->y = this->top;
          this->accum = 0;
          this->bitcount = 0;
          this->sp = this->stack;
          this->firstcode = 0;
          this->oldcode = 0;
          this->needfirst = true;
          this->out_of_bounds = this->sheight <= this->top || this->swidth <= this->left;
        }
        break;
      case TableImageLZWSize:
        this->lzwsize = uVar18;
        SVar16 = Error;
        if (bVar14 < 0xd) {
          lVar30 = 1L << (bVar14 & 0x3f);
          this->code_size = uVar18 + 1;
          iVar17 = (int)lVar30;
          this->clear_code = iVar17;
          this->end_code = iVar17 + 1;
          this->max_code_size = 2 << (bVar14 & 0x1f);
          this->max_code = iVar17 + 2;
          psVar21 = this->table[0];
          psVar6 = this->table[1];
          lVar29 = 0;
          do {
            psVar21[lVar29] = 0;
            psVar6[lVar29] = (short)lVar29;
            lVar29 = lVar29 + 1;
          } while (lVar30 != lVar29);
          SVar16 = ImageDataBlockSize;
        }
        this->state = SVar16;
        goto LAB_00103e2f;
      case ImageDataBlockSize:
        this->expectcount = uVar18;
        if (bVar14 == 0) {
          this->state = Introducer;
          this->digress = true;
          this->newFrame = true;
        }
        else {
          this->state = ImageDataBlock;
        }
        break;
      case ImageDataBlock:
        uVar15 = this->bitcount;
        iVar27 = this->count + 1;
        this->count = iVar27;
        iVar17 = -0x8000;
        if (uVar15 != 0xffff8000) {
          if (0x1f < uVar15) goto LAB_001044b4;
          this->accum = this->accum | uVar18 << ((byte)uVar15 & 0x1f);
          iVar17 = uVar15 + 8;
          this->bitcount = iVar17;
        }
        iVar43 = this->code_size;
        if (iVar43 <= iVar17) {
          do {
            uVar18 = this->clear_code;
            uVar15 = ~(-1 << ((byte)iVar43 & 0x1f)) & this->accum;
            this->bitcount = iVar17 - iVar43;
            this->accum = this->accum >> ((byte)iVar43 & 0x1f);
            if (uVar15 == uVar18) {
              if (this->needfirst == false) {
                this->code_size = this->lzwsize + 1;
                this->max_code_size = uVar15 * 2;
                this->max_code = uVar15 + 2;
              }
              this->needfirst = true;
            }
            else if (uVar15 == this->end_code) {
              this->bitcount = -0x8000;
            }
            else if (this->needfirst == true) {
              this->oldcode = uVar15;
              this->firstcode = uVar15;
              if (this->out_of_bounds == false) {
                iVar17 = QImage::height();
                if ((this->y < iVar17) &&
                   ((this->frame == 0 || (this->firstcode != this->trans_index)))) {
                  uVar15 = this->firstcode & 0xff;
                  uVar18 = 0xffffff;
                  if ((int)uVar15 <= this->ncols) {
                    if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                      uVar33 = 0;
                    }
                    else {
                      uVar33 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                        (ulong)uVar15 * 4);
                    }
                    uVar18 = uVar33 & 0xffffff;
                    if (this->trans_index != uVar15) {
                      uVar18 = uVar33;
                    }
                  }
                  *(uint *)(local_a0 + (long)this->x * 4 + this->y * local_98) = uVar18;
                }
              }
              iVar17 = this->x + 1;
              this->x = iVar17;
              if (this->swidth <= iVar17) {
                this->out_of_bounds = true;
              }
              this->needfirst = false;
              iVar27 = this->left;
              if (this->width + iVar27 <= iVar17) {
                this->x = iVar27;
                this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar27;
                nextY(this,local_a0,(int)local_98);
              }
            }
            else {
              this->incode = uVar15;
              iVar17 = this->max_code;
              psVar21 = this->sp;
              uVar33 = uVar15;
              if (iVar17 <= (int)uVar15) {
                this->sp = psVar21 + 1;
                *psVar21 = (short)this->firstcode;
                psVar21 = psVar21 + 1;
                uVar33 = this->oldcode;
              }
              psVar6 = this->table[0];
              psVar7 = this->table[1];
              lVar30 = (long)psVar21 - (long)this->stack;
              while (psVar32 = psVar21 + 1, (int)(uVar18 + 2) <= (int)uVar33) {
                if (iVar17 <= (int)uVar33) goto LAB_001044b4;
                sVar5 = psVar7[(int)uVar33];
                this->sp = psVar32;
                *psVar21 = sVar5;
                if ((uVar33 == (int)psVar6[(int)uVar33]) ||
                   (lVar30 = lVar30 + 2, uVar33 = (int)psVar6[(int)uVar33], psVar21 = psVar32,
                   0x3ffe < lVar30)) goto LAB_001044b4;
              }
              if ((int)uVar33 < 0) goto LAB_001044b4;
              psVar6 = this->table[1];
              sVar5 = psVar6[uVar33];
              this->firstcode = (int)sVar5;
              this->sp = psVar32;
              *psVar21 = sVar5;
              if (iVar17 < 0x1000) {
                this->table[0][iVar17] = (short)this->oldcode;
                psVar6[iVar17] = sVar5;
                this->max_code = iVar17 + 1;
                iVar27 = this->max_code_size;
                if (iVar27 < 0x1000 && iVar27 <= iVar17 + 1) {
                  this->max_code_size = iVar27 * 2;
                  this->code_size = iVar43 + 1;
                }
              }
              this->oldcode = uVar15;
              iVar17 = QImage::height();
              bVar14 = this->out_of_bounds;
              if ((bool)bVar14 == false) {
                if (this->y < iVar17) {
                  puVar25 = local_a0 + this->y * local_98;
                }
                else {
                  puVar25 = (uchar *)0x0;
                }
              }
              else {
                puVar25 = (uchar *)0x0;
              }
              while (this->stack < this->sp) {
                pbVar26 = (byte *)(this->sp + -1);
                this->sp = (short *)pbVar26;
                if (((bVar14 & 1) == 0) && (this->y < iVar17)) {
                  bVar2 = *pbVar26;
                  uVar18 = (uint)bVar2;
                  if ((this->frame == 0) || (this->trans_index != uVar18)) {
                    uVar15 = 0xffffff;
                    if ((int)uVar18 <= this->ncols) {
                      if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                        uVar33 = 0;
                      }
                      else {
                        uVar33 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                          (ulong)bVar2 * 4);
                      }
                      uVar15 = uVar33 & 0xffffff;
                      if (this->trans_index != uVar18) {
                        uVar15 = uVar33;
                      }
                    }
                    *(uint *)(puVar25 + (long)this->x * 4) = uVar15;
                  }
                }
                iVar27 = this->x + 1;
                this->x = iVar27;
                if (this->swidth <= iVar27) {
                  this->out_of_bounds = true;
                  bVar14 = 1;
                }
                iVar43 = this->left;
                if (this->width + iVar43 <= iVar27) {
                  this->x = iVar43;
                  this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar43;
                  nextY(this,local_a0,(int)local_98);
                  bVar14 = this->out_of_bounds;
                  if (((bool)bVar14 == false) && (this->y < iVar17)) {
                    puVar25 = local_a0 + this->y * local_98;
                  }
                }
              }
            }
            iVar17 = this->bitcount;
            iVar43 = this->code_size;
          } while ((iVar43 <= iVar17) && (this->state == ImageDataBlock));
          iVar27 = this->count;
        }
        this->partialNewFrame = true;
        if (iVar27 == this->expectcount) {
          this->count = 0;
          this->state = ImageDataBlockSize;
        }
        break;
      case ExtensionLabel:
        SVar16 = (uint)(bVar14 != 0xff) * 3 + ApplicationExtension;
        if (bVar14 == 0xf9) {
          SVar16 = GraphicControlExtension;
        }
LAB_00103e2b:
        this->state = SVar16;
LAB_00103e2f:
        this->count = 0;
        break;
      case GraphicControlExtension:
        uVar18 = this->count;
        if ((long)(int)uVar18 < 5) {
          this->hold[(int)uVar18] = bVar14;
          uVar18 = this->count;
        }
        this->count = uVar18 + 1;
        if (uVar18 == this->hold[0]) {
          disposePrevious(this,image);
          bVar14 = this->hold[1] >> 2 & 7;
          if (3 < bVar14) {
            bVar14 = 0;
          }
          this->disposal = (uint)bVar14;
          uVar18 = (uint)*(ushort *)(this->hold + 2);
          if (this->count < 4) {
            uVar18 = 1;
          }
          iVar17 = uVar18 * 10;
          if (uVar18 < 2) {
            iVar17 = 100;
          }
          *nextFrameDelay = iVar17;
          this->trans_index = -(uint)((this->hold[1] & 1) == 0) | (uint)this->hold[4];
          this->count = 0;
LAB_00103e01:
          this->state = SkipBlockSize;
        }
        break;
      case ApplicationExtension:
        uVar18 = this->count;
        if ((long)(int)uVar18 < 0xb) {
          this->hold[(int)uVar18] = bVar14;
          uVar18 = this->count;
        }
        this->count = uVar18 + 1;
        if (uVar18 == this->hold[0]) {
          SVar16 = (uint)(*(long *)(this->hold + 1) != 0x455041435354454e) * 2 +
                   NetscapeExtensionBlockSize;
          goto LAB_00103e2b;
        }
        break;
      case NetscapeExtensionBlockSize:
        this->expectcount = uVar18;
        this->count = 0;
        if (bVar14 == 0) {
LAB_00103d10:
          this->state = Introducer;
        }
        else {
          this->state = NetscapeExtensionBlock;
        }
        break;
      case NetscapeExtensionBlock:
        iVar17 = this->count;
        if ((long)iVar17 < 3) {
          this->hold[iVar17] = bVar14;
          iVar17 = this->count;
        }
        this->count = iVar17 + 1;
        if (iVar17 + 1 == this->expectcount) {
          *loopCount = (uint)*(ushort *)(this->hold + 1);
          goto LAB_00103e01;
        }
        break;
      case SkipBlockSize:
        this->expectcount = uVar18;
        this->count = 0;
        if (bVar14 == 0) goto LAB_00103d10;
        this->state = SkipBlock;
        break;
      case SkipBlock:
        iVar17 = this->count + 1;
        this->count = iVar17;
        if (iVar17 == this->expectcount) goto LAB_00103e01;
        break;
      case Done:
        this->digress = true;
        break;
      case Error:
        goto switchD_001033ba_caseD_11;
      }
LAB_00103e37:
      iVar36 = iVar36 + -1;
    } while ((this->digress == false) && (buffer = buffer + 1, iVar36 != 0));
  }
  return length - iVar36;
}

Assistant:

int QGIFFormat::decode(QImage *image, const uchar *buffer, int length,
                       int *nextFrameDelay, int *loopCount)
{
    // We are required to state that
    //    "The Graphics Interchange Format(c) is the Copyright property of
    //    CompuServe Incorporated. GIF(sm) is a Service Mark property of
    //    CompuServe Incorporated."

    if (!stack) {
        stack = new short[(1 << max_lzw_bits) * 4];
        table[0] = &stack[(1 << max_lzw_bits) * 2];
        table[1] = &stack[(1 << max_lzw_bits) * 3];
    }

    image->detach();
    qsizetype bpl = image->bytesPerLine();
    unsigned char *bits = image->bits();

#define LM(l, m) (((m)<<8)|l)
    digress = false;
    const int initial = length;
    while (!digress && length) {
        length--;
        unsigned char ch=*buffer++;
        switch (state) {
          case Header:
            hold[count++]=ch;
            if (count==6) {
                // Header
                gif89=(hold[3]!='8' || hold[4]!='7');
                state=LogicalScreenDescriptor;
                count=0;
            }
            break;
          case LogicalScreenDescriptor:
            hold[count++]=ch;
            if (count==7) {
                // Logical Screen Descriptor
                swidth=LM(hold[0], hold[1]);
                sheight=LM(hold[2], hold[3]);
                gcmap=!!(hold[4]&0x80);
                //UNUSED: bpchan=(((hold[4]&0x70)>>3)+1);
                //UNUSED: gcmsortflag=!!(hold[4]&0x08);
                gncols=2<<(hold[4]&0x7);
                bgcol=(gcmap) ? hold[5] : -1;
                //aspect=hold[6] ? double(hold[6]+15)/64.0 : 1.0;

                trans_index = -1;
                count=0;
                ncols=gncols;
                if (gcmap) {
                    ccount=0;
                    state=GlobalColorMap;
                    globalcmap = new QRgb[gncols+1]; // +1 for trans_index
                    globalcmap[gncols] = Q_TRANSPARENT;
                } else {
                    state=Introducer;
                }
            }
            break;
          case GlobalColorMap: case LocalColorMap:
            hold[count++]=ch;
            if (count==3) {
                QRgb rgb = qRgb(hold[0], hold[1], hold[2]);
                if (state == LocalColorMap) {
                    if (ccount < lncols)
                        localcmap[ccount] =  rgb;
                } else {
                    globalcmap[ccount] = rgb;
                }
                if (++ccount >= ncols) {
                    if (state == LocalColorMap)
                        state=TableImageLZWSize;
                    else
                        state=Introducer;
                }
                count=0;
            }
            break;
          case Introducer:
            hold[count++]=ch;
            switch (ch) {
              case ',':
                state=ImageDescriptor;
                break;
              case '!':
                state=ExtensionLabel;
                break;
              case ';':
                  // ### Changed: QRect(0, 0, swidth, sheight)
                state=Done;
                break;
              default:
                digress=true;
                // Unexpected Introducer - ignore block
                state=Error;
            }
            break;
          case ImageDescriptor:
            hold[count++]=ch;
            if (count==10) {
                int newleft=LM(hold[1], hold[2]);
                int newtop=LM(hold[3], hold[4]);
                int newwidth=LM(hold[5], hold[6]);
                int newheight=LM(hold[7], hold[8]);

                // disbelieve ridiculous logical screen sizes,
                // unless the image frames are also large.
                if (swidth/10 > qMax(newwidth,16384))
                    swidth = -1;
                if (sheight/10 > qMax(newheight,16384))
                    sheight = -1;

                if (swidth <= 0)
                    swidth = newleft + newwidth;
                if (sheight <= 0)
                    sheight = newtop + newheight;

                QImage::Format format = trans_index >= 0 ? QImage::Format_ARGB32 : QImage::Format_RGB32;
                if (image->isNull()) {
                    if (!withinSizeLimit(swidth, sheight)) {
                        state = Error;
                        return -1;
                    }
                    if (!QImageIOHandler::allocateImage(QSize(swidth, sheight), format, image)) {
                        state = Error;
                        return -1;
                    }
                    bpl = image->bytesPerLine();
                    bits = image->bits();
                    if (bits)
                        memset(bits, 0, image->sizeInBytes());
                }

                // Check if the previous attempt to create the image failed. If it
                // did then the image is broken and we should give up.
                if (image->isNull()) {
                    state = Error;
                    return -1;
                }

                disposePrevious(image);
                disposed = false;

                left = newleft;
                top = newtop;
                width = newwidth;
                height = newheight;

                right=qMax(0, qMin(left+width, swidth)-1);
                bottom=qMax(0, qMin(top+height, sheight)-1);
                lcmap=!!(hold[9]&0x80);
                interlace=!!(hold[9]&0x40);
                //bool lcmsortflag=!!(hold[9]&0x20);
                lncols=lcmap ? (2<<(hold[9]&0x7)) : 0;
                if (lncols) {
                    if (localcmap)
                        delete [] localcmap;
                    localcmap = new QRgb[lncols+1];
                    localcmap[lncols] = Q_TRANSPARENT;
                    ncols = lncols;
                } else {
                    ncols = gncols;
                }
                frame++;
                if (frame == 0) {
                    if (left || top || width<swidth || height<sheight) {
                        // Not full-size image - erase with bg or transparent
                        if (trans_index >= 0) {
                            fillRect(image, 0, 0, swidth, sheight, color(trans_index));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        } else if (bgcol>=0) {
                            fillRect(image, 0, 0, swidth, sheight, color(bgcol));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        }
                    }
                }

                if (disposal == RestoreImage) {
                    int l = qMin(swidth-1,left);
                    int r = qMin(swidth-1,right);
                    int t = qMin(sheight-1,top);
                    int b = qMin(sheight-1,bottom);
                    int w = r-l+1;
                    int h = b-t+1;

                    if (backingstore.width() < w
                        || backingstore.height() < h) {

                        if (!withinSizeLimit(w, h)) {
                            state = Error;
                            return -1;
                        }
                        // We just use the backing store as a byte array
                        QSize bsSize(qMax(backingstore.width(), w), qMax(backingstore.height(), h));
                        if (!QImageIOHandler::allocateImage(bsSize, QImage::Format_RGB32,
                                                            &backingstore)) {
                            state = Error;
                            return -1;
                        }
                        memset(backingstore.bits(), 0, backingstore.sizeInBytes());
                    }
                    const qsizetype dest_bpl = backingstore.bytesPerLine();
                    unsigned char *dest_data = backingstore.bits();
                    for (int ln=0; ln<h; ln++) {
                        memcpy(FAST_SCAN_LINE(dest_data, dest_bpl, ln),
                               FAST_SCAN_LINE(bits, bpl, t+ln) + l*sizeof(QRgb), w*sizeof(QRgb));
                    }
                }

                count=0;
                if (lcmap) {
                    ccount=0;
                    state=LocalColorMap;
                } else {
                    state=TableImageLZWSize;
                }
                x = left;
                y = top;
                accum = 0;
                bitcount = 0;
                sp = stack;
                firstcode = oldcode = 0;
                needfirst = true;
                out_of_bounds = left>=swidth || y>=sheight;
            }
            break;
          case TableImageLZWSize: {
            lzwsize=ch;
            if (lzwsize > max_lzw_bits) {
                state=Error;
            } else {
                code_size=lzwsize+1;
                clear_code=1<<lzwsize;
                end_code=clear_code+1;
                max_code_size=2*clear_code;
                max_code=clear_code+2;
                int i;
                for (i=0; i<clear_code; i++) {
                    table[0][i]=0;
                    table[1][i]=i;
                }
                state=ImageDataBlockSize;
            }
            count=0;
            break;
          } case ImageDataBlockSize:
            expectcount=ch;
            if (expectcount) {
                state=ImageDataBlock;
            } else {
                state=Introducer;
                digress = true;
                newFrame = true;
            }
            break;
          case ImageDataBlock:
            count++;
            if (bitcount != -32768) {
                if (bitcount < 0 || bitcount > 31) {
                    state = Error;
                    return -1;
                }
                accum |= (ch << bitcount);
                bitcount += 8;
            }
            while (bitcount>=code_size && state==ImageDataBlock) {
                int code=accum&((1<<code_size)-1);
                bitcount-=code_size;
                accum>>=code_size;

                if (code==clear_code) {
                    if (!needfirst) {
                        code_size=lzwsize+1;
                        max_code_size=2*clear_code;
                        max_code=clear_code+2;
                    }
                    needfirst=true;
                } else if (code==end_code) {
                    bitcount = -32768;
                    // Left the block end arrive
                } else {
                    if (needfirst) {
                        firstcode=oldcode=code;
                        if (!out_of_bounds && image->height() > y && ((frame == 0) || (firstcode != trans_index)))
                            ((QRgb*)FAST_SCAN_LINE(bits, bpl, y))[x] = color(firstcode);
                        x++;
                        if (x>=swidth) out_of_bounds = true;
                        needfirst=false;
                        if (x>=left+width) {
                            x=left;
                            out_of_bounds = left>=swidth || y>=sheight;
                            nextY(bits, bpl);
                        }
                    } else {
                        incode=code;
                        if (code>=max_code) {
                            *sp++=firstcode;
                            code=oldcode;
                        }
                        while (code>=clear_code+2) {
                            if (code >= max_code) {
                                state = Error;
                                return -1;
                            }
                            *sp++=table[1][code];
                            if (code==table[0][code]) {
                                state=Error;
                                return -1;
                            }
                            if (sp-stack>=(1<<(max_lzw_bits))*2) {
                                state=Error;
                                return -1;
                            }
                            code=table[0][code];
                        }
                        if (code < 0) {
                            state = Error;
                            return -1;
                        }

                        *sp++=firstcode=table[1][code];
                        code=max_code;
                        if (code<(1<<max_lzw_bits)) {
                            table[0][code]=oldcode;
                            table[1][code]=firstcode;
                            max_code++;
                            if ((max_code>=max_code_size)
                             && (max_code_size<(1<<max_lzw_bits)))
                            {
                                max_code_size*=2;
                                code_size++;
                            }
                        }
                        oldcode=incode;
                        const int h = image->height();
                        QRgb *line = nullptr;
                        if (!out_of_bounds && h > y)
                            line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                        while (sp>stack) {
                            const uchar index = *(--sp);
                            if (!out_of_bounds && h > y && ((frame == 0) || (index != trans_index))) {
                                line[x] = color(index);
                            }
                            x++;
                            if (x>=swidth) out_of_bounds = true;
                            if (x>=left+width) {
                                x=left;
                                out_of_bounds = left>=swidth || y>=sheight;
                                nextY(bits, bpl);
                                if (!out_of_bounds && h > y)
                                    line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                            }
                        }
                    }
                }
            }
            partialNewFrame = true;
            if (count==expectcount) {
                count=0;
                state=ImageDataBlockSize;
            }
            break;
          case ExtensionLabel:
            switch (ch) {
            case 0xf9:
                state=GraphicControlExtension;
                break;
            case 0xff:
                state=ApplicationExtension;
                break;
#if 0
            case 0xfe:
                state=CommentExtension;
                break;
            case 0x01:
                break;
#endif
            default:
                state=SkipBlockSize;
            }
            count=0;
            break;
          case ApplicationExtension:
            if (count<11) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                if (qstrncmp((char*)(hold+1), "NETSCAPE", 8)==0) {
                    // Looping extension
                    state=NetscapeExtensionBlockSize;
                } else {
                    state=SkipBlockSize;
                }
                count=0;
            }
            break;
          case NetscapeExtensionBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=NetscapeExtensionBlock;
            else state=Introducer;
            break;
          case NetscapeExtensionBlock:
            if (count<3) hold[count]=ch;
            count++;
            if (count==expectcount) {
                *loopCount = hold[1]+hold[2]*256;
                state=SkipBlockSize; // Ignore further blocks
            }
            break;
          case GraphicControlExtension:
            if (count<5) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                disposePrevious(image);
                uint dBits = (hold[1] >> 2) & 0x7;
                disposal = (dBits <= RestoreImage) ? Disposal(dBits) : NoDisposal;
                //UNUSED: waitforuser=!!((hold[1]>>1)&0x1);
                int delay=count>3 ? LM(hold[2], hold[3]) : 1;
                // IE and mozilla use a minimum delay of 10. With the minimum delay of 10
                // we are compatible to them and avoid huge loads on the app and xserver.
                *nextFrameDelay = (delay < 2 ? 10 : delay) * 10;

                bool havetrans=hold[1]&0x1;
                trans_index = havetrans ? hold[4] : -1;

                count=0;
                state=SkipBlockSize;
            }
            break;
          case SkipBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=SkipBlock;
            else state=Introducer;
            break;
          case SkipBlock:
            count++;
            if (count==expectcount) state=SkipBlockSize;
            break;
          case Done:
            digress=true;
            /* Netscape ignores the junk, so we do too.
            length++; // Unget
            state=Error; // More calls to this is an error
            */
            break;
          case Error:
            return -1; // Called again after done.
        }
    }
    return initial-length;
}